

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linmath.h
# Opt level: O0

void mat4x4_identity(vec4 *M)

{
  float local_1c;
  int local_18;
  int local_14;
  int j;
  int i;
  vec4 *M_local;
  
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      local_1c = 1.0;
      if (local_14 != local_18) {
        local_1c = 0.0;
      }
      M[local_14][local_18] = local_1c;
    }
  }
  return;
}

Assistant:

static inline void mat4x4_identity(mat4x4 M)
{
	int i, j;
	for(i=0; i<4; ++i)
		for(j=0; j<4; ++j)
			M[i][j] = i==j ? 1.f : 0.f;
}